

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_seal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int freeze_flag)

{
  JSAtom prop;
  JSValue getter;
  JSValue setter;
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int64_t iVar5;
  JSValueUnion p;
  JSValue this_obj;
  JSValue JVar6;
  uint32_t len;
  JSPropertyEnum *props;
  JSPropertyDescriptor desc;
  uint local_ac;
  JSPropertyEnum *local_a8;
  JSPropertyEnum *local_a0;
  JSValueUnion local_98;
  JSValueUnion local_90;
  undefined4 local_88;
  uint uStack_84;
  undefined8 uStack_80;
  undefined4 local_78;
  uint uStack_74;
  undefined8 uStack_70;
  JSPropertyDescriptor local_68;
  
  p = (JSValueUnion)(argv->u).ptr;
  iVar5 = argv->tag;
  if ((uint)iVar5 == 0xffffffff) {
    iVar1 = JS_PreventExtensions(ctx,*argv);
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        JS_ThrowTypeError(ctx,"proxy preventExtensions handler returned false");
      }
      else {
        iVar1 = JS_GetOwnPropertyNamesInternal(ctx,&local_a0,&local_ac,(JSObject *)p.ptr,3);
        if (iVar1 == 0) {
          local_98 = p;
          if ((ulong)local_ac != 0) {
            local_a8 = local_a0;
            uVar4 = 0;
            local_90 = p;
            do {
              prop = local_a8[uVar4].atom;
              iVar1 = 0x4100;
              if (freeze_flag == 0) {
LAB_00132ed1:
                local_78 = 0;
                uStack_70 = 3;
                local_88 = 0;
                uStack_80 = 3;
                getter.tag = 3;
                getter.u.ptr = (void *)((ulong)uStack_74 << 0x20);
                setter.tag = 3;
                setter.u.ptr = (void *)((ulong)uStack_84 << 0x20);
                this_obj.tag = iVar5;
                this_obj.u.ptr = local_90.ptr;
                iVar1 = JS_DefineProperty(ctx,this_obj,prop,(JSValue)(ZEXT816(3) << 0x40),getter,
                                          setter,iVar1);
                uVar3 = iVar1 >> 0x1f & 5;
              }
              else {
                iVar2 = JS_GetOwnPropertyInternal(ctx,&local_68,(JSObject *)local_98.ptr,prop);
                if (-1 < iVar2) {
                  if (iVar2 != 0) {
                    iVar1 = (local_68.flags & 2U | 0x41) << 8;
                    js_free_desc(ctx,&local_68);
                  }
                  goto LAB_00132ed1;
                }
                uVar3 = 5;
              }
              if (uVar3 != 0) {
                if (uVar3 != 5) {
                  p.float64 = 0.0;
                  uVar4 = 0;
                  goto LAB_00132dd5;
                }
                js_free_prop_enum(ctx,local_a8,local_ac);
                goto LAB_00132e44;
              }
              uVar4 = uVar4 + 1;
            } while (local_ac != uVar4);
          }
          js_free_prop_enum(ctx,local_a0,local_ac);
          *(int *)p.ptr = *p.ptr + 1;
          goto LAB_00132dc8;
        }
      }
    }
LAB_00132e44:
    p.float64 = 0.0;
    uVar4 = 0;
    iVar5 = 6;
  }
  else {
    if (0xfffffff4 < (uint)iVar5) {
      *(int *)p.ptr = *p.ptr + 1;
    }
LAB_00132dc8:
    uVar4 = (ulong)p.ptr & 0xffffffff00000000;
  }
LAB_00132dd5:
  JVar6.u.ptr = (void *)((ulong)p.ptr & 0xffffffff | uVar4);
  JVar6.tag = iVar5;
  return JVar6;
}

Assistant:

static JSValue js_object_seal(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int freeze_flag)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, desc_flags, res;

    if (!JS_IsObject(obj))
        return JS_DupValue(ctx, obj);

    res = JS_PreventExtensions(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res) {
        return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
    }
    
    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        desc_flags = JS_PROP_THROW | JS_PROP_HAS_CONFIGURABLE;
        if (freeze_flag) {
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
            if (res < 0)
                goto exception;
            if (res) {
                if (desc.flags & JS_PROP_WRITABLE)
                    desc_flags |= JS_PROP_HAS_WRITABLE;
                js_free_desc(ctx, &desc);
            }
        }
        if (JS_DefineProperty(ctx, obj, prop, JS_UNDEFINED,
                              JS_UNDEFINED, JS_UNDEFINED, desc_flags) < 0)
            goto exception;
    }
    js_free_prop_enum(ctx, props, len);
    return JS_DupValue(ctx, obj);

 exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}